

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

EnumValueDescriptor * __thiscall
google::protobuf::FileDescriptorTables::FindEnumValueByNumberCreatingIfUnknown
          (FileDescriptorTables *this,EnumDescriptor *parent,int number)

{
  WrappedMutex *__mutex;
  Tables *this_00;
  second_type pEVar1;
  DescriptorPool *pDVar2;
  string *psVar3;
  EnumValueOptions *pEVar4;
  EnumValuesByNumberMap *collection;
  EnumValueDescriptor *result;
  string enum_value_name;
  EnumValueDescriptor *local_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_90._M_dataplus._M_p = (pointer)parent;
  local_90._M_string_length._0_4_ = number;
  pEVar1 = FindPtrOrNull<std::unordered_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::EnumDescriptor_const*,int>const,google::protobuf::EnumValueDescriptor_const*>>>>
                     (&this->enum_values_by_number_,(first_type *)&local_90);
  if (pEVar1 == (second_type)0x0) {
    __mutex = &this->unknown_enum_values_mu_;
    std::mutex::lock(&__mutex->mu_);
    collection = &this->unknown_enum_values_by_number_;
    local_90._M_dataplus._M_p = (pointer)parent;
    local_90._M_string_length._0_4_ = number;
    pEVar1 = FindPtrOrNull<std::unordered_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::EnumDescriptor_const*,int>const,google::protobuf::EnumValueDescriptor_const*>>>>
                       (collection,(first_type *)&local_90);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if (pEVar1 == (second_type)0x0) {
      std::mutex::lock(&__mutex->mu_);
      local_90._M_dataplus._M_p = (pointer)parent;
      local_90._M_string_length._0_4_ = number;
      pEVar1 = FindPtrOrNull<std::unordered_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::EnumDescriptor_const*,int>const,google::protobuf::EnumValueDescriptor_const*>>>>
                         (collection,(first_type *)&local_90);
      if (pEVar1 == (second_type)0x0) {
        StringPrintf_abi_cxx11_
                  (&local_90,"UNKNOWN_ENUM_VALUE_%s_%d",**(undefined8 **)parent,(ulong)(uint)number)
        ;
        pDVar2 = DescriptorPool::generated_pool();
        this_00 = (pDVar2->tables_)._M_t.
                  super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                  .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                  _M_head_impl;
        pEVar1 = DescriptorPool::Tables::Allocate<google::protobuf::EnumValueDescriptor>(this_00);
        local_98 = pEVar1;
        psVar3 = DescriptorPool::Tables::AllocateString(this_00,&local_90);
        *(string **)pEVar1 = psVar3;
        std::operator+(&local_50,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (parent + 8),".");
        std::operator+(&local_70,&local_50,&local_90);
        psVar3 = DescriptorPool::Tables::AllocateString(this_00,&local_70);
        *(string **)(pEVar1 + 8) = psVar3;
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        *(int *)(pEVar1 + 0x10) = number;
        *(EnumDescriptor **)(pEVar1 + 0x18) = parent;
        pEVar4 = EnumValueOptions::default_instance();
        *(EnumValueOptions **)(pEVar1 + 0x20) = pEVar4;
        local_70._M_dataplus._M_p = (pointer)parent;
        local_70._M_string_length._0_4_ = number;
        InsertIfNotPresent<std::unordered_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::EnumDescriptor_const*,int>const,google::protobuf::EnumValueDescriptor_const*>>>>
                  (collection,(first_type *)&local_70,&local_98);
        std::__cxx11::string::~string((string *)&local_90);
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
  }
  return pEVar1;
}

Assistant:

inline const EnumValueDescriptor*
FileDescriptorTables::FindEnumValueByNumberCreatingIfUnknown(
    const EnumDescriptor* parent, int number) const {
  // First try, with map of compiled-in values.
  {
    const EnumValueDescriptor* desc = FindPtrOrNull(
        enum_values_by_number_, std::make_pair(parent, number));
    if (desc != nullptr) {
      return desc;
    }
  }
  // Second try, with reader lock held on unknown enum values: common case.
  {
    ReaderMutexLock l(&unknown_enum_values_mu_);
    const EnumValueDescriptor* desc = FindPtrOrNull(
        unknown_enum_values_by_number_, std::make_pair(parent, number));
    if (desc != nullptr) {
      return desc;
    }
  }
  // If not found, try again with writer lock held, and create new descriptor if
  // necessary.
  {
    WriterMutexLock l(&unknown_enum_values_mu_);
    const EnumValueDescriptor* desc = FindPtrOrNull(
        unknown_enum_values_by_number_, std::make_pair(parent, number));
    if (desc != nullptr) {
      return desc;
    }

    // Create an EnumValueDescriptor dynamically. We don't insert it into the
    // EnumDescriptor (it's not a part of the enum as originally defined), but
    // we do insert it into the table so that we can return the same pointer
    // later.
    std::string enum_value_name = StringPrintf("UNKNOWN_ENUM_VALUE_%s_%d",
                                               parent->name().c_str(), number);
    DescriptorPool::Tables* tables = const_cast<DescriptorPool::Tables*>(
        DescriptorPool::generated_pool()->tables_.get());
    EnumValueDescriptor* result = tables->Allocate<EnumValueDescriptor>();
    result->name_ = tables->AllocateString(enum_value_name);
    result->full_name_ =
        tables->AllocateString(parent->full_name() + "." + enum_value_name);
    result->number_ = number;
    result->type_ = parent;
    result->options_ = &EnumValueOptions::default_instance();
    InsertIfNotPresent(&unknown_enum_values_by_number_,
                            std::make_pair(parent, number), result);
    return result;
  }
}